

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O1

void evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
               (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                *e,double ref_solution)

{
  ostream *poVar1;
  ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
  local_13;
  double local_10;
  
  local_10 = ref_solution;
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at compile-time (4,6,8): ",0x1a);
  evaluation_compiletime<1l,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
  ::
  apply<viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
            (e,&local_13,local_10);
  return;
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::ct_constant<4> ct4;
  viennamath::ct_constant<6> ct6;
  viennamath::ct_constant<8> ct8;

  std::cout << e << " at compile-time (4,6,8): ";
  evaluation_compiletime<viennamath::result_of::is_ct_evaluable<E>::value,
                         E
                        >::apply(e, viennamath::make_vector(ct4, ct6, ct8), ref_solution);

}